

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitStore(PrintExpressionContents *this,Store *curr)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  address64_t aVar4;
  Module *in_R8;
  Name name;
  BasicType local_30 [2];
  uintptr_t local_28;
  uintptr_t local_20;
  Store *local_18;
  Store *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (Store *)this;
  poVar3 = prepareColor(this->o);
  local_28 = (local_18->valueType).id;
  local_20 = (uintptr_t)forceConcrete((Type)local_28);
  wasm::operator<<(poVar3,(Type)local_20);
  if ((local_18->isAtomic & 1U) != 0) {
    std::operator<<(this->o,".atomic");
  }
  std::operator<<(this->o,".store");
  bVar2 = true;
  if (3 < local_18->bytes) {
    local_30[1] = 3;
    bVar1 = wasm::Type::operator==(&local_18->valueType,local_30 + 1);
    bVar2 = false;
    if (bVar1) {
      bVar2 = local_18->bytes < 8;
    }
  }
  if (bVar2) {
    if (local_18->bytes == '\x01') {
      std::operator<<(this->o,'8');
    }
    else if (local_18->bytes == '\x02') {
      local_30[0] = f32;
      bVar2 = wasm::Type::operator==(&local_18->valueType,local_30);
      if (bVar2) {
        std::operator<<(this->o,"_f16");
      }
      else {
        std::operator<<(this->o,"16");
      }
    }
    else {
      if (local_18->bytes != '\x04') {
        abort();
      }
      std::operator<<(this->o,"32");
    }
  }
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(local_18->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(local_18->memory).super_IString.str._M_len,name,
             (ostream *)this->wasm,in_R8);
  aVar4 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
  if (aVar4 != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    aVar4 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
    std::ostream::operator<<(poVar3,aVar4);
  }
  aVar4 = wasm::Address::operator_cast_to_unsigned_long(&local_18->align);
  if (aVar4 != local_18->bytes) {
    poVar3 = std::operator<<(this->o," align=");
    aVar4 = wasm::Address::operator_cast_to_unsigned_long(&local_18->align);
    std::ostream::operator<<(poVar3,aVar4);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    prepareColor(o) << forceConcrete(curr->valueType);
    if (curr->isAtomic) {
      o << ".atomic";
    }
    o << ".store";
    if (curr->bytes < 4 || (curr->valueType == Type::i64 && curr->bytes < 8)) {
      if (curr->bytes == 1) {
        o << '8';
      } else if (curr->bytes == 2) {
        if (curr->valueType == Type::f32) {
          o << "_f16";
        } else {
          o << "16";
        }
      } else if (curr->bytes == 4) {
        o << "32";
      } else {
        abort();
      }
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->bytes) {
      o << " align=" << curr->align;
    }
  }